

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

int close_input(void)

{
  long lVar1;
  long lVar2;
  char *stptr;
  
  if (proc_ptr == (t_proc *)0x0) {
    if (in_macro == 0) {
      if (input_file[infile_num].if_level == if_level) {
        if (infile_num < 2) {
          return -1;
        }
        fclose((FILE *)in_fp);
        lVar2 = (long)infile_num;
        lVar1 = lVar2 + -1;
        infile_num = (int)lVar1;
        infile_error = -1;
        lVar2 = lVar1 * 0x80 + lVar2 * 8;
        slnum = *(int *)((long)input_file + lVar2);
        in_fp = *(FILE **)(lVar2 + 0x11ed08);
        if (pass != 1) {
          infile_error = -1;
          return 0;
        }
        if (xlist == 0) {
          infile_error = -1;
          return 0;
        }
        if (list_level == 0) {
          infile_error = -1;
          return 0;
        }
        fprintf((FILE *)lst_fp,"#[%i]   %s\n",lVar1,lVar1 * 0x88 + 0x11ed20);
        return 0;
      }
      stptr = "Incomplete IF/ENDIF statement!";
    }
    else {
      stptr = "Incomplete MACRO definition!";
    }
  }
  else {
    stptr = "Incomplete PROC!";
  }
  fatal_error(stptr);
  return -1;
}

Assistant:

int
close_input(void)
{
	if (proc_ptr) {
		fatal_error("Incomplete PROC!");
		return (-1);
	}
	if (in_macro) {
		fatal_error("Incomplete MACRO definition!");
		return (-1);
	}
	if (input_file[infile_num].if_level != if_level) {
		fatal_error("Incomplete IF/ENDIF statement!");
		return (-1);
	}
	if (infile_num <= 1)
		return (-1);

	fclose(in_fp);
	infile_num--;
	infile_error = -1;
	slnum = input_file[infile_num].lnum;
	in_fp = input_file[infile_num].fp;
	if ((pass == LAST_PASS) && (xlist) && (list_level))
		fprintf(lst_fp, "#[%i]   %s\n", infile_num, input_file[infile_num].name);

	/* ok */
	return (0);
}